

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
          (IfcConstructionResource *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  IfcResource::IfcResource((IfcResource *)this,vtt + 1);
  pp_Var1 = (_func_int **)vtt[0x17];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = pp_Var1;
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>)
                   ._vptr_ObjectHelper) = vtt[0x18];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x1d];
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x20
  ;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x20 = 0;
  this->field_0x110 = 0;
  (this->ResourceGroup).ptr._M_dataplus._M_p = (pointer)&(this->ResourceGroup).ptr.field_2;
  (this->ResourceGroup).ptr._M_string_length = 0;
  (this->ResourceGroup).ptr.field_2._M_local_buf[0] = '\0';
  (this->ResourceGroup).have = false;
  (this->ResourceConsumption).ptr._M_dataplus._M_p =
       (pointer)&(this->ResourceConsumption).ptr.field_2;
  (this->ResourceConsumption).ptr._M_string_length = 0;
  (this->ResourceConsumption).ptr.field_2._M_local_buf[0] = '\0';
  (this->ResourceConsumption).have = false;
  (this->BaseQuantity).ptr.obj = (LazyObject *)0x0;
  (this->BaseQuantity).have = false;
  return;
}

Assistant:

IfcConstructionResource() : Object("IfcConstructionResource") {}